

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Polyline2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  CX3DImporter_NodeElement *ne;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> lineSegments;
  string an;
  string use;
  string def;
  CX3DImporter_NodeElement *local_d8;
  X3DImporter *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_c0;
  string local_a8;
  string local_88;
  _List_node_base local_68;
  long local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_c0;
  local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  _M_size = 0;
  local_d8 = (CX3DImporter_NodeElement *)0x0;
  local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_d0 = this;
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string
                ((string *)&local_a8,(char *)CONCAT44(extraout_var,iVar7),(allocator *)&local_68);
      iVar7 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar10 = &local_50;
LAB_006a38a7:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        this = local_d0;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar10 = &local_88;
          goto LAB_006a38a7;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_a8);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_a8), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_a8), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar7 == 0) {
            XML_ReadNode_GetAttrVal_AsListVec2f(this,(int)uVar12,&local_c0);
          }
          else {
            Throw_IncorrectAttr(this,&local_a8);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar6 != uVar11);
  }
  if (local_88._M_string_length == 0) {
    local_d8 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_d8->Type = ENET_Polyline2D;
    (local_d8->ID)._M_dataplus._M_p = (pointer)&(local_d8->ID).field_2;
    (local_d8->ID)._M_string_length = 0;
    (local_d8->ID).field_2._M_local_buf[0] = '\0';
    local_d8->Parent = pCVar4;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_d8->Child;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d8->Child;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_d8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008f0838;
    *(CX3DImporter_NodeElement **)&local_d8[1].Type = local_d8 + 1;
    local_d8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_d8 + 1);
    local_d8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_d8[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_d8->ID);
    }
    local_68._M_next = &local_68;
    local_58 = 0;
    local_68._M_prev = local_68._M_next;
    for (p_Var8 = local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        p_Var8 != (_List_node_base *)&local_c0;
        p_Var8 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                  &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_c4 = (undefined4)*(size_t *)(p_Var8 + 1);
      local_c8 = *(undefined4 *)((long)(p_Var8 + 1) + 4);
      p_Var9 = (_List_node_base *)operator_new(0x20);
      *(undefined4 *)&p_Var9[1]._M_next = local_c4;
      *(undefined4 *)((long)&p_Var9[1]._M_next + 4) = local_c8;
      *(undefined4 *)&p_Var9[1]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      local_58 = local_58 + 1;
    }
    GeometryHelper_Extend_PointToLine
              (this,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_68,
               (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(local_d8 + 1));
    local_d8[1].ID._M_string_length = 2;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_d8;
    if ((char)iVar7 == '\0') {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Polyline2D","");
      ParseNode_Metadata(local_d0,pCVar4,&local_a8);
      this = local_d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
        this = local_d0;
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      p_Var8[1]._M_next = (_List_node_base *)local_d8;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(this->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var8 = local_68._M_next;
    while (p_Var8 != &local_68) {
      p_Var9 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var9;
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_88,ENET_Polyline2D,&local_d8);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_88);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = local_c0.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var8 != (_List_node_base *)&local_c0) {
    p_Var9 = p_Var8->_M_next;
    operator_delete(p_Var8);
    p_Var8 = p_Var9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Polyline2D()
{
    std::string def, use;
    std::list<aiVector2D> lineSegments;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("lineSegments", lineSegments, XML_ReadNode_GetAttrVal_AsListVec2f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Polyline2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Polyline2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		//
		// convert read point list of geometry object to line set.
		//
		std::list<aiVector3D> tlist;

		// convert vec2 to vec3
		for(std::list<aiVector2D>::iterator it2 = lineSegments.begin(); it2 != lineSegments.end(); ++it2) tlist.push_back(aiVector3D(it2->x, it2->y, 0));

		// convert point set to line set
		GeometryHelper_Extend_PointToLine(tlist, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Polyline2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}